

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  bVar14 = false;
  uVar7 = std::__cxx11::string::find((string *)unit_string,(ulong)modifier);
  if (uVar7 != 0xffffffffffffffff) {
    cVar12 = (char)unit_string;
    lVar8 = std::__cxx11::string::find_first_not_of(cVar12,0x20);
    if ((lVar8 == -1) ||
       (pcVar3 = (unit_string->_M_dataplus)._M_p, cVar1 = pcVar3[lVar8],
       cVar1 != check1 && cVar1 != check2)) {
      bVar14 = false;
    }
    else {
      pcVar3[lVar8 + -1] = '_';
      bVar14 = true;
    }
    uVar9 = std::__cxx11::string::find(cVar12,0x20);
    if (uVar9 < unit_string->_M_string_length) {
      pcVar3 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar9 + 1];
      if ((cVar1 != '*') && (cVar1 != '/')) {
        cVar2 = pcVar3[uVar9 - 1];
        bVar13 = cVar2 == '*' || cVar2 == '/';
        if ((cVar2 != '*') && (cVar2 != '/')) {
          bVar13 = true;
          bVar4 = bVar13;
          bVar5 = bVar13;
          if ((cVar2 != '(' && cVar1 != '(') && (bVar5 = false, cVar1 != '-')) {
            bVar4 = cVar2 == '-';
          }
          bVar15 = bVar13;
          if (!(bool)(bVar5 | bVar4)) {
            iVar6 = std::__cxx11::string::compare((ulong)unit_string,uVar9 + 1,(char *)0x2);
            bVar15 = iVar6 == 0;
          }
          bVar15 = (bool)(bVar15 | bVar5 | bVar4);
          if (!bVar15) {
            bVar13 = (unit_string->_M_dataplus)._M_p[uVar9 + 1] == 'U';
          }
          bVar13 = (bool)(bVar13 | bVar15);
        }
        bVar4 = bVar13;
        if (!bVar13) {
          uVar10 = std::__cxx11::string::rfind(cVar12,0x2f);
          uVar11 = std::__cxx11::string::find(cVar12,0x2f);
          if (uVar10 < uVar7) {
            std::__cxx11::string::insert((ulong)unit_string,uVar10 + 1,'\x01');
            if (uVar11 == 0xffffffffffffffff) {
              std::__cxx11::string::push_back(cVar12);
            }
            else {
              std::__cxx11::string::insert((ulong)unit_string,uVar11 + 1,'\x01');
            }
            bVar4 = uVar11 <= uVar9;
            bVar14 = true;
            uVar9 = uVar9 + 1;
          }
          else {
            bVar4 = true;
            if (uVar9 <= uVar11) {
              bVar4 = bVar13;
            }
          }
        }
        if (!bVar4) {
          (unit_string->_M_dataplus)._M_p[uVar9] = '*';
          bVar14 = true;
        }
      }
    }
  }
  return bVar14;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}